

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O3

void opj_t1_dec_sigpass_mqc(opj_t1_t *t1,OPJ_INT32 bpno,OPJ_INT32 cblksty)

{
  OPJ_UINT32 *pOVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  OPJ_UINT32 OVar5;
  opj_mqc_state_t *poVar6;
  OPJ_BYTE *pOVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  OPJ_UINT32 c;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  opj_mqc_t *mqc;
  OPJ_UINT32 i;
  int iVar16;
  opj_mqc_state_t **ppoVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  OPJ_UINT32 OVar22;
  uint *puVar23;
  uint *puVar24;
  OPJ_UINT32 OVar25;
  OPJ_INT32 *data;
  uint *puVar26;
  uint *puVar27;
  opj_flag_t *flagsp;
  ulong uVar28;
  bool bVar29;
  OPJ_INT32 oneplushalf;
  uint local_48;
  
  uVar13 = t1->w;
  uVar20 = (ulong)uVar13;
  if ((uVar20 == 0x40) && (t1->h == 0x40)) {
    puVar23 = t1->flags + 0x43;
    uVar8 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    uVar9 = -uVar8;
    puVar27 = (uint *)t1->data;
    ppoVar17 = (t1->mqc).curctx;
    uVar13 = (t1->mqc).c;
    uVar12 = (t1->mqc).a;
    OVar22 = (t1->mqc).ct;
    uVar15 = 0;
    if ((cblksty & 8U) == 0) {
      do {
        iVar16 = 0;
        do {
          puVar26 = puVar27;
          puVar24 = puVar23;
          uVar10 = *puVar24;
          uVar20 = (ulong)uVar10;
          if (uVar20 != 0) {
            if ((uVar10 & 0x1ef) != 0 && (uVar10 & 0x200010) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar20 & 0x1ef];
              ppoVar17 = (t1->mqc).ctxs + bVar3;
              poVar6 = (t1->mqc).ctxs[bVar3];
              uVar21 = poVar6->qeval;
              uVar18 = uVar12 - uVar21;
              if (uVar13 >> 0x10 < uVar21) {
                uVar19 = poVar6->mps;
                *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar18];
                uVar12 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar7 = (t1->mqc).bp;
                    bVar3 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x200;
                        OVar22 = 7;
                        goto LAB_00128912;
                      }
                      uVar13 = uVar13 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar7 + 1;
                      uVar13 = uVar13 + (uint)bVar3 * 0x100;
                    }
                    OVar22 = 8;
                  }
LAB_00128912:
                  uVar12 = uVar12 * 2;
                  uVar13 = uVar13 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar12 < 0x8000);
                uVar14 = (uint)(uVar19 == 0);
                if (uVar18 < uVar21) {
                  uVar14 = uVar19;
                }
              }
              else {
                uVar13 = uVar13 + uVar21 * -0x10000;
                uVar12 = uVar18;
                if ((short)uVar18 < 0) {
                  uVar14 = poVar6->mps;
                }
                else {
                  uVar19 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar18 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar3 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar3 * 0x200;
                          OVar22 = 7;
                          goto LAB_00128990;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_00128990:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar14 = (uint)(uVar19 == 0);
                  if (uVar21 <= uVar18) {
                    uVar14 = uVar19;
                  }
                }
              }
              if (uVar14 != 0) {
                uVar21 = uVar10 >> 0x10 & 0x40 | uVar10 & 0xaa | uVar10 >> 0xe & 0x10 |
                         puVar24[-1] >> 0x13 & 1 | puVar24[1] >> 0x11 & 4;
                bVar3 = ""[uVar21];
                ppoVar17 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar21];
                poVar6 = *ppoVar17;
                uVar21 = poVar6->qeval;
                uVar18 = uVar12 - uVar21;
                if (uVar13 >> 0x10 < uVar21) {
                  uVar19 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar18];
                  uVar12 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar4 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x200;
                          OVar22 = 7;
                          goto LAB_00128a98;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar4 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_00128a98:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar14 = (uint)(uVar19 == 0);
                  if (uVar18 < uVar21) {
                    uVar14 = uVar19;
                  }
                }
                else {
                  uVar13 = uVar13 + uVar21 * -0x10000;
                  uVar12 = uVar18;
                  if ((short)uVar18 < 0) {
                    uVar14 = poVar6->mps;
                  }
                  else {
                    uVar19 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar4 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar13 = uVar13 + (uint)bVar4 * 0x200;
                            OVar22 = 7;
                            goto LAB_00128b16;
                          }
                          uVar13 = uVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_00128b16:
                      uVar12 = uVar12 * 2;
                      uVar13 = uVar13 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar12 < 0x8000);
                    uVar14 = (uint)(uVar19 == 0);
                    if (uVar21 <= uVar18) {
                      uVar14 = uVar19;
                    }
                  }
                }
                uVar18 = uVar14 ^ bVar3;
                uVar21 = uVar9;
                if (uVar14 == bVar3) {
                  uVar21 = uVar8;
                }
                *puVar26 = uVar21;
                *(byte *)(puVar24 + -1) = (byte)puVar24[-1] | 0x20;
                uVar10 = uVar18 << 0x13 | uVar10 | 0x10;
                *(byte *)(puVar24 + 1) = (byte)puVar24[1] | 8;
                *(ulong *)(puVar24 + -0x43) =
                     CONCAT44(uVar18 << 0x1f,0x20000) | 0x1000000000000 |
                     *(ulong *)(puVar24 + -0x43);
                *(byte *)((long)puVar24 + -0x103) = *(byte *)((long)puVar24 + -0x103) | 0x80;
              }
              uVar20 = (ulong)(uVar10 | 0x200000);
            }
            uVar10 = (uint)uVar20;
            if ((uVar20 & 0xf78) != 0 && (uVar20 & 0x1000080) == 0) {
              uVar18 = (uint)(uVar20 >> 3);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar18 & 0x1ef];
              ppoVar17 = (t1->mqc).ctxs + bVar3;
              poVar6 = (t1->mqc).ctxs[bVar3];
              uVar21 = poVar6->qeval;
              uVar19 = uVar12 - uVar21;
              if (uVar13 >> 0x10 < uVar21) {
                uVar14 = poVar6->mps;
                *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar19];
                uVar12 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar7 = (t1->mqc).bp;
                    bVar3 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x200;
                        OVar22 = 7;
                        goto LAB_00128c68;
                      }
                      uVar13 = uVar13 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar7 + 1;
                      uVar13 = uVar13 + (uint)bVar3 * 0x100;
                    }
                    OVar22 = 8;
                  }
LAB_00128c68:
                  uVar12 = uVar12 * 2;
                  uVar13 = uVar13 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar12 < 0x8000);
                uVar11 = (uint)(uVar14 == 0);
                if (uVar19 < uVar21) {
                  uVar11 = uVar14;
                }
              }
              else {
                uVar13 = uVar13 + uVar21 * -0x10000;
                uVar12 = uVar19;
                if ((short)uVar19 < 0) {
                  uVar11 = poVar6->mps;
                }
                else {
                  uVar14 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar3 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar3 * 0x200;
                          OVar22 = 7;
                          goto LAB_00128ce6;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_00128ce6:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar11 = (uint)(uVar14 == 0);
                  if (uVar21 <= uVar19) {
                    uVar11 = uVar14;
                  }
                }
              }
              if (uVar11 != 0) {
                uVar21 = (uint)(uVar20 >> 0x13) & 0x40 | uVar18 & 0xaa |
                         (uint)(uVar20 >> 0xf) & 0x10 | puVar24[-1] >> 0x16 & 1 |
                         puVar24[1] >> 0x14 & 4;
                bVar3 = ""[uVar21];
                ppoVar17 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar21];
                poVar6 = *ppoVar17;
                uVar21 = poVar6->qeval;
                uVar18 = uVar12 - uVar21;
                if (uVar13 >> 0x10 < uVar21) {
                  uVar19 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar18];
                  uVar12 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar4 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x200;
                          OVar22 = 7;
                          goto LAB_00128dea;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar4 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_00128dea:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar14 = (uint)(uVar19 == 0);
                  if (uVar18 < uVar21) {
                    uVar14 = uVar19;
                  }
                }
                else {
                  uVar13 = uVar13 + uVar21 * -0x10000;
                  uVar12 = uVar18;
                  if ((short)uVar18 < 0) {
                    uVar14 = poVar6->mps;
                  }
                  else {
                    uVar19 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar4 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar13 = uVar13 + (uint)bVar4 * 0x200;
                            OVar22 = 7;
                            goto LAB_00128e68;
                          }
                          uVar13 = uVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_00128e68:
                      uVar12 = uVar12 * 2;
                      uVar13 = uVar13 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar12 < 0x8000);
                    uVar14 = (uint)(uVar19 == 0);
                    if (uVar21 <= uVar18) {
                      uVar14 = uVar19;
                    }
                  }
                }
                uVar21 = uVar9;
                if (uVar14 == bVar3) {
                  uVar21 = uVar8;
                }
                puVar26[0x40] = uVar21;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 1;
                uVar10 = uVar10 | (uVar14 ^ bVar3) << 0x16 | 0x80;
                *(byte *)(puVar24 + 1) = (byte)puVar24[1] | 0x40;
              }
              uVar20 = (ulong)(uVar10 | 0x1000000);
            }
            uVar10 = (uint)uVar20;
            if ((uVar20 & 0x7bc0) != 0 && (uVar20 & 0x8000400) == 0) {
              uVar18 = (uint)(uVar20 >> 6);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar18 & 0x1ef];
              ppoVar17 = (t1->mqc).ctxs + bVar3;
              poVar6 = (t1->mqc).ctxs[bVar3];
              uVar21 = poVar6->qeval;
              uVar19 = uVar12 - uVar21;
              if (uVar13 >> 0x10 < uVar21) {
                uVar14 = poVar6->mps;
                *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar19];
                uVar12 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar7 = (t1->mqc).bp;
                    bVar3 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x200;
                        OVar22 = 7;
                        goto LAB_00128f8a;
                      }
                      uVar13 = uVar13 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar7 + 1;
                      uVar13 = uVar13 + (uint)bVar3 * 0x100;
                    }
                    OVar22 = 8;
                  }
LAB_00128f8a:
                  uVar12 = uVar12 * 2;
                  uVar13 = uVar13 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar12 < 0x8000);
                uVar11 = (uint)(uVar14 == 0);
                if (uVar19 < uVar21) {
                  uVar11 = uVar14;
                }
              }
              else {
                uVar13 = uVar13 + uVar21 * -0x10000;
                uVar12 = uVar19;
                if ((short)uVar19 < 0) {
                  uVar11 = poVar6->mps;
                }
                else {
                  uVar14 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar3 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar3 * 0x200;
                          OVar22 = 7;
                          goto LAB_00129008;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_00129008:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar11 = (uint)(uVar14 == 0);
                  if (uVar21 <= uVar19) {
                    uVar11 = uVar14;
                  }
                }
              }
              if (uVar11 != 0) {
                uVar21 = (uint)(uVar20 >> 0x16) & 0x40 | uVar18 & 0xaa |
                         (uint)(uVar20 >> 0x12) & 0x10 | puVar24[-1] >> 0x19 & 1 |
                         puVar24[1] >> 0x17 & 4;
                bVar3 = ""[uVar21];
                ppoVar17 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar21];
                poVar6 = *ppoVar17;
                uVar21 = poVar6->qeval;
                uVar18 = uVar12 - uVar21;
                if (uVar13 >> 0x10 < uVar21) {
                  uVar19 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar18];
                  uVar12 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar4 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x200;
                          OVar22 = 7;
                          goto LAB_0012910c;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar4 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_0012910c:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar14 = (uint)(uVar19 == 0);
                  if (uVar18 < uVar21) {
                    uVar14 = uVar19;
                  }
                }
                else {
                  uVar13 = uVar13 + uVar21 * -0x10000;
                  uVar12 = uVar18;
                  if ((short)uVar18 < 0) {
                    uVar14 = poVar6->mps;
                  }
                  else {
                    uVar19 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar4 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar13 = uVar13 + (uint)bVar4 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012918a;
                          }
                          uVar13 = uVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012918a:
                      uVar12 = uVar12 * 2;
                      uVar13 = uVar13 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar12 < 0x8000);
                    uVar14 = (uint)(uVar19 == 0);
                    if (uVar21 <= uVar18) {
                      uVar14 = uVar19;
                    }
                  }
                }
                uVar21 = uVar9;
                if (uVar14 == bVar3) {
                  uVar21 = uVar8;
                }
                puVar26[0x80] = uVar21;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 8;
                uVar10 = uVar10 | (uVar14 ^ bVar3) << 0x19 | 0x400;
                *(byte *)((long)puVar24 + 5) = *(byte *)((long)puVar24 + 5) | 2;
              }
              uVar20 = (ulong)(uVar10 | 0x8000000);
            }
            uVar10 = (uint)uVar20;
            if ((uVar20 & 0x3de00) != 0 && (uVar20 & 0x40002000) == 0) {
              uVar18 = (uint)(uVar20 >> 9);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar18 & 0x1ef];
              ppoVar17 = (t1->mqc).ctxs + bVar3;
              poVar6 = (t1->mqc).ctxs[bVar3];
              uVar21 = poVar6->qeval;
              uVar19 = uVar12 - uVar21;
              if (uVar13 >> 0x10 < uVar21) {
                uVar14 = poVar6->mps;
                *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar19];
                uVar12 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar7 = (t1->mqc).bp;
                    bVar3 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x200;
                        OVar22 = 7;
                        goto LAB_001292ac;
                      }
                      uVar13 = uVar13 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar7 + 1;
                      uVar13 = uVar13 + (uint)bVar3 * 0x100;
                    }
                    OVar22 = 8;
                  }
LAB_001292ac:
                  uVar12 = uVar12 * 2;
                  uVar13 = uVar13 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar12 < 0x8000);
                uVar11 = (uint)(uVar14 == 0);
                if (uVar19 < uVar21) {
                  uVar11 = uVar14;
                }
              }
              else {
                uVar13 = uVar13 + uVar21 * -0x10000;
                uVar12 = uVar19;
                if ((short)uVar19 < 0) {
                  uVar11 = poVar6->mps;
                }
                else {
                  uVar14 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar3 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar3 * 0x200;
                          OVar22 = 7;
                          goto LAB_0012932a;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_0012932a:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar11 = (uint)(uVar14 == 0);
                  if (uVar21 <= uVar19) {
                    uVar11 = uVar14;
                  }
                }
              }
              if (uVar11 != 0) {
                uVar21 = (uint)(uVar20 >> 0x19) & 0x40 | uVar18 & 0xaa |
                         (uint)(uVar20 >> 0x15) & 0x10 | puVar24[-1] >> 0x1c & 1 |
                         puVar24[1] >> 0x1a & 4;
                bVar3 = ""[uVar21];
                ppoVar17 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar21];
                poVar6 = *ppoVar17;
                uVar21 = poVar6->qeval;
                uVar18 = uVar12 - uVar21;
                if (uVar13 >> 0x10 < uVar21) {
                  uVar19 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar18];
                  uVar12 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar4 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x200;
                          OVar22 = 7;
                          goto LAB_0012942e;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar4 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_0012942e:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar14 = (uint)(uVar19 == 0);
                  if (uVar18 < uVar21) {
                    uVar14 = uVar19;
                  }
                }
                else {
                  uVar13 = uVar13 + uVar21 * -0x10000;
                  uVar12 = uVar18;
                  if ((short)uVar18 < 0) {
                    uVar14 = poVar6->mps;
                  }
                  else {
                    uVar19 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar4 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar13 = uVar13 + (uint)bVar4 * 0x200;
                            OVar22 = 7;
                            goto LAB_001294ac;
                          }
                          uVar13 = uVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_001294ac:
                      uVar12 = uVar12 * 2;
                      uVar13 = uVar13 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar12 < 0x8000);
                    uVar14 = (uint)(uVar19 == 0);
                    if (uVar21 <= uVar18) {
                      uVar14 = uVar19;
                    }
                  }
                }
                uVar18 = uVar14 ^ bVar3;
                uVar21 = uVar9;
                if (uVar14 == bVar3) {
                  uVar21 = uVar8;
                }
                puVar26[0xc0] = uVar21;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 0x40;
                *(byte *)((long)puVar24 + 5) = *(byte *)((long)puVar24 + 5) | 0x10;
                uVar10 = uVar10 | uVar18 << 0x1c | 0x2000;
                *(ulong *)(puVar24 + 0x41) =
                     CONCAT44(uVar18 << 0x12,4) | 0x200000000 | *(ulong *)(puVar24 + 0x41);
                *(byte *)(puVar24 + 0x43) = (byte)puVar24[0x43] | 1;
              }
              uVar10 = uVar10 | 0x40000000;
            }
            *puVar24 = uVar10;
          }
          iVar16 = iVar16 + 1;
          puVar23 = puVar24 + 1;
          puVar27 = puVar26 + 1;
        } while (iVar16 != 0x40);
        puVar27 = puVar26 + 0xc1;
        puVar23 = puVar24 + 3;
        bVar29 = uVar15 < 0x3c;
        uVar15 = uVar15 + 4;
      } while (bVar29);
    }
    else {
      do {
        iVar16 = 0;
        do {
          puVar26 = puVar27;
          puVar24 = puVar23;
          uVar10 = *puVar24;
          uVar20 = (ulong)uVar10;
          if (uVar20 != 0) {
            if ((uVar10 & 0x1ef) != 0 && (uVar10 & 0x200010) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar20 & 0x1ef];
              ppoVar17 = (t1->mqc).ctxs + bVar3;
              poVar6 = (t1->mqc).ctxs[bVar3];
              uVar21 = poVar6->qeval;
              uVar18 = uVar12 - uVar21;
              if (uVar13 >> 0x10 < uVar21) {
                uVar19 = poVar6->mps;
                *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar18];
                uVar12 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar7 = (t1->mqc).bp;
                    bVar3 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x200;
                        OVar22 = 7;
                        goto LAB_0012964f;
                      }
                      uVar13 = uVar13 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar7 + 1;
                      uVar13 = uVar13 + (uint)bVar3 * 0x100;
                    }
                    OVar22 = 8;
                  }
LAB_0012964f:
                  uVar12 = uVar12 * 2;
                  uVar13 = uVar13 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar12 < 0x8000);
                uVar14 = (uint)(uVar19 == 0);
                if (uVar18 < uVar21) {
                  uVar14 = uVar19;
                }
              }
              else {
                uVar13 = uVar13 + uVar21 * -0x10000;
                uVar12 = uVar18;
                if ((short)uVar18 < 0) {
                  uVar14 = poVar6->mps;
                }
                else {
                  uVar19 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar18 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar3 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar3 * 0x200;
                          OVar22 = 7;
                          goto LAB_001296d5;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_001296d5:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar14 = (uint)(uVar19 == 0);
                  if (uVar21 <= uVar18) {
                    uVar14 = uVar19;
                  }
                }
              }
              if (uVar14 != 0) {
                uVar21 = uVar10 >> 0x10 & 0x40 | uVar10 & 0xaa | uVar10 >> 0xe & 0x10 |
                         puVar24[-1] >> 0x13 & 1 | puVar24[1] >> 0x11 & 4;
                bVar3 = ""[uVar21];
                ppoVar17 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar21];
                poVar6 = *ppoVar17;
                uVar21 = poVar6->qeval;
                uVar18 = uVar12 - uVar21;
                if (uVar13 >> 0x10 < uVar21) {
                  uVar19 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar18];
                  uVar12 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar4 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x200;
                          OVar22 = 7;
                          goto LAB_001297df;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar4 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_001297df:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar14 = (uint)(uVar19 == 0);
                  if (uVar18 < uVar21) {
                    uVar14 = uVar19;
                  }
                }
                else {
                  uVar13 = uVar13 + uVar21 * -0x10000;
                  uVar12 = uVar18;
                  if ((short)uVar18 < 0) {
                    uVar14 = poVar6->mps;
                  }
                  else {
                    uVar19 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar4 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar13 = uVar13 + (uint)bVar4 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012985c;
                          }
                          uVar13 = uVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012985c:
                      uVar12 = uVar12 * 2;
                      uVar13 = uVar13 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar12 < 0x8000);
                    uVar14 = (uint)(uVar19 == 0);
                    if (uVar21 <= uVar18) {
                      uVar14 = uVar19;
                    }
                  }
                }
                uVar21 = uVar9;
                if (uVar14 == bVar3) {
                  uVar21 = uVar8;
                }
                *puVar26 = uVar21;
                *(byte *)(puVar24 + -1) = (byte)puVar24[-1] | 0x20;
                uVar10 = (uVar14 ^ bVar3) << 0x13 | uVar10 | 0x10;
                *(byte *)(puVar24 + 1) = (byte)puVar24[1] | 8;
              }
              uVar20 = (ulong)(uVar10 | 0x200000);
            }
            uVar10 = (uint)uVar20;
            if ((uVar20 & 0xf78) != 0 && (uVar20 & 0x1000080) == 0) {
              uVar18 = (uint)(uVar20 >> 3);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar18 & 0x1ef];
              ppoVar17 = (t1->mqc).ctxs + bVar3;
              poVar6 = (t1->mqc).ctxs[bVar3];
              uVar21 = poVar6->qeval;
              uVar19 = uVar12 - uVar21;
              if (uVar13 >> 0x10 < uVar21) {
                uVar14 = poVar6->mps;
                *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar19];
                uVar12 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar7 = (t1->mqc).bp;
                    bVar3 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x200;
                        OVar22 = 7;
                        goto LAB_00129979;
                      }
                      uVar13 = uVar13 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar7 + 1;
                      uVar13 = uVar13 + (uint)bVar3 * 0x100;
                    }
                    OVar22 = 8;
                  }
LAB_00129979:
                  uVar12 = uVar12 * 2;
                  uVar13 = uVar13 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar12 < 0x8000);
                uVar11 = (uint)(uVar14 == 0);
                if (uVar19 < uVar21) {
                  uVar11 = uVar14;
                }
              }
              else {
                uVar13 = uVar13 + uVar21 * -0x10000;
                uVar12 = uVar19;
                if ((short)uVar19 < 0) {
                  uVar11 = poVar6->mps;
                }
                else {
                  uVar14 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar3 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar3 * 0x200;
                          OVar22 = 7;
                          goto LAB_001299f7;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_001299f7:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar11 = (uint)(uVar14 == 0);
                  if (uVar21 <= uVar19) {
                    uVar11 = uVar14;
                  }
                }
              }
              if (uVar11 != 0) {
                uVar21 = (uint)(uVar20 >> 0x13) & 0x40 | uVar18 & 0xaa |
                         (uint)(uVar20 >> 0xf) & 0x10 | puVar24[-1] >> 0x16 & 1 |
                         puVar24[1] >> 0x14 & 4;
                bVar3 = ""[uVar21];
                ppoVar17 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar21];
                poVar6 = *ppoVar17;
                uVar21 = poVar6->qeval;
                uVar18 = uVar12 - uVar21;
                if (uVar13 >> 0x10 < uVar21) {
                  uVar19 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar18];
                  uVar12 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar4 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x200;
                          OVar22 = 7;
                          goto LAB_00129afb;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar4 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_00129afb:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar14 = (uint)(uVar19 == 0);
                  if (uVar18 < uVar21) {
                    uVar14 = uVar19;
                  }
                }
                else {
                  uVar13 = uVar13 + uVar21 * -0x10000;
                  uVar12 = uVar18;
                  if ((short)uVar18 < 0) {
                    uVar14 = poVar6->mps;
                  }
                  else {
                    uVar19 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar4 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar13 = uVar13 + (uint)bVar4 * 0x200;
                            OVar22 = 7;
                            goto LAB_00129b79;
                          }
                          uVar13 = uVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_00129b79:
                      uVar12 = uVar12 * 2;
                      uVar13 = uVar13 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar12 < 0x8000);
                    uVar14 = (uint)(uVar19 == 0);
                    if (uVar21 <= uVar18) {
                      uVar14 = uVar19;
                    }
                  }
                }
                uVar21 = uVar9;
                if (uVar14 == bVar3) {
                  uVar21 = uVar8;
                }
                puVar26[0x40] = uVar21;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 1;
                uVar10 = uVar10 | (uVar14 ^ bVar3) << 0x16 | 0x80;
                *(byte *)(puVar24 + 1) = (byte)puVar24[1] | 0x40;
              }
              uVar20 = (ulong)(uVar10 | 0x1000000);
            }
            uVar10 = (uint)uVar20;
            if ((uVar20 & 0x7bc0) != 0 && (uVar20 & 0x8000400) == 0) {
              uVar18 = (uint)(uVar20 >> 6);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar18 & 0x1ef];
              ppoVar17 = (t1->mqc).ctxs + bVar3;
              poVar6 = (t1->mqc).ctxs[bVar3];
              uVar21 = poVar6->qeval;
              uVar19 = uVar12 - uVar21;
              if (uVar13 >> 0x10 < uVar21) {
                uVar14 = poVar6->mps;
                *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar19];
                uVar12 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar7 = (t1->mqc).bp;
                    bVar3 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x200;
                        OVar22 = 7;
                        goto LAB_00129c9b;
                      }
                      uVar13 = uVar13 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar7 + 1;
                      uVar13 = uVar13 + (uint)bVar3 * 0x100;
                    }
                    OVar22 = 8;
                  }
LAB_00129c9b:
                  uVar12 = uVar12 * 2;
                  uVar13 = uVar13 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar12 < 0x8000);
                uVar11 = (uint)(uVar14 == 0);
                if (uVar19 < uVar21) {
                  uVar11 = uVar14;
                }
              }
              else {
                uVar13 = uVar13 + uVar21 * -0x10000;
                uVar12 = uVar19;
                if ((short)uVar19 < 0) {
                  uVar11 = poVar6->mps;
                }
                else {
                  uVar14 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar3 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar3 * 0x200;
                          OVar22 = 7;
                          goto LAB_00129d19;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_00129d19:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar11 = (uint)(uVar14 == 0);
                  if (uVar21 <= uVar19) {
                    uVar11 = uVar14;
                  }
                }
              }
              if (uVar11 != 0) {
                uVar21 = (uint)(uVar20 >> 0x16) & 0x40 | uVar18 & 0xaa |
                         (uint)(uVar20 >> 0x12) & 0x10 | puVar24[-1] >> 0x19 & 1 |
                         puVar24[1] >> 0x17 & 4;
                bVar3 = ""[uVar21];
                ppoVar17 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar21];
                poVar6 = *ppoVar17;
                uVar21 = poVar6->qeval;
                uVar18 = uVar12 - uVar21;
                if (uVar13 >> 0x10 < uVar21) {
                  uVar19 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar18];
                  uVar12 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar4 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x200;
                          OVar22 = 7;
                          goto LAB_00129e1d;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar4 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_00129e1d:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar14 = (uint)(uVar19 == 0);
                  if (uVar18 < uVar21) {
                    uVar14 = uVar19;
                  }
                }
                else {
                  uVar13 = uVar13 + uVar21 * -0x10000;
                  uVar12 = uVar18;
                  if ((short)uVar18 < 0) {
                    uVar14 = poVar6->mps;
                  }
                  else {
                    uVar19 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar4 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar13 = uVar13 + (uint)bVar4 * 0x200;
                            OVar22 = 7;
                            goto LAB_00129e9b;
                          }
                          uVar13 = uVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_00129e9b:
                      uVar12 = uVar12 * 2;
                      uVar13 = uVar13 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar12 < 0x8000);
                    uVar14 = (uint)(uVar19 == 0);
                    if (uVar21 <= uVar18) {
                      uVar14 = uVar19;
                    }
                  }
                }
                uVar21 = uVar9;
                if (uVar14 == bVar3) {
                  uVar21 = uVar8;
                }
                puVar26[0x80] = uVar21;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 8;
                uVar10 = uVar10 | (uVar14 ^ bVar3) << 0x19 | 0x400;
                *(byte *)((long)puVar24 + 5) = *(byte *)((long)puVar24 + 5) | 2;
              }
              uVar20 = (ulong)(uVar10 | 0x8000000);
            }
            uVar10 = (uint)uVar20;
            if ((uVar20 & 0x3de00) != 0 && (uVar20 & 0x40002000) == 0) {
              uVar18 = (uint)(uVar20 >> 9);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar18 & 0x1ef];
              ppoVar17 = (t1->mqc).ctxs + bVar3;
              poVar6 = (t1->mqc).ctxs[bVar3];
              uVar21 = poVar6->qeval;
              uVar19 = uVar12 - uVar21;
              if (uVar13 >> 0x10 < uVar21) {
                uVar14 = poVar6->mps;
                *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar19];
                uVar12 = uVar21;
                do {
                  if (OVar22 == 0) {
                    pOVar7 = (t1->mqc).bp;
                    bVar3 = pOVar7[1];
                    if (*pOVar7 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x200;
                        OVar22 = 7;
                        goto LAB_00129fbd;
                      }
                      uVar13 = uVar13 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar7 + 1;
                      uVar13 = uVar13 + (uint)bVar3 * 0x100;
                    }
                    OVar22 = 8;
                  }
LAB_00129fbd:
                  uVar12 = uVar12 * 2;
                  uVar13 = uVar13 * 2;
                  OVar22 = OVar22 - 1;
                } while (uVar12 < 0x8000);
                uVar11 = (uint)(uVar14 == 0);
                if (uVar19 < uVar21) {
                  uVar11 = uVar14;
                }
              }
              else {
                uVar13 = uVar13 + uVar21 * -0x10000;
                uVar12 = uVar19;
                if ((short)uVar19 < 0) {
                  uVar11 = poVar6->mps;
                }
                else {
                  uVar14 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar21];
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar3 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar3 * 0x200;
                          OVar22 = 7;
                          goto LAB_0012a03b;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar3 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_0012a03b:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar11 = (uint)(uVar14 == 0);
                  if (uVar21 <= uVar19) {
                    uVar11 = uVar14;
                  }
                }
              }
              if (uVar11 != 0) {
                uVar21 = (uint)(uVar20 >> 0x19) & 0x40 | uVar18 & 0xaa |
                         (uint)(uVar20 >> 0x15) & 0x10 | puVar24[-1] >> 0x1c & 1 |
                         puVar24[1] >> 0x1a & 4;
                bVar3 = ""[uVar21];
                ppoVar17 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar21];
                poVar6 = *ppoVar17;
                uVar21 = poVar6->qeval;
                uVar18 = uVar12 - uVar21;
                if (uVar13 >> 0x10 < uVar21) {
                  uVar19 = poVar6->mps;
                  *ppoVar17 = (&poVar6->nmps)[uVar21 <= uVar18];
                  uVar12 = uVar21;
                  do {
                    if (OVar22 == 0) {
                      pOVar7 = (t1->mqc).bp;
                      bVar4 = pOVar7[1];
                      if (*pOVar7 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x200;
                          OVar22 = 7;
                          goto LAB_0012a13f;
                        }
                        uVar13 = uVar13 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar7 + 1;
                        uVar13 = uVar13 + (uint)bVar4 * 0x100;
                      }
                      OVar22 = 8;
                    }
LAB_0012a13f:
                    uVar12 = uVar12 * 2;
                    uVar13 = uVar13 * 2;
                    OVar22 = OVar22 - 1;
                  } while (uVar12 < 0x8000);
                  uVar14 = (uint)(uVar19 == 0);
                  if (uVar18 < uVar21) {
                    uVar14 = uVar19;
                  }
                }
                else {
                  uVar13 = uVar13 + uVar21 * -0x10000;
                  uVar12 = uVar18;
                  if ((short)uVar18 < 0) {
                    uVar14 = poVar6->mps;
                  }
                  else {
                    uVar19 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 < uVar21];
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar4 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar13 = uVar13 + (uint)bVar4 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012a1bd;
                          }
                          uVar13 = uVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar13 = uVar13 + (uint)bVar4 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012a1bd:
                      uVar12 = uVar12 * 2;
                      uVar13 = uVar13 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar12 < 0x8000);
                    uVar14 = (uint)(uVar19 == 0);
                    if (uVar21 <= uVar18) {
                      uVar14 = uVar19;
                    }
                  }
                }
                uVar18 = uVar14 ^ bVar3;
                uVar21 = uVar9;
                if (uVar14 == bVar3) {
                  uVar21 = uVar8;
                }
                puVar26[0xc0] = uVar21;
                *(byte *)((long)puVar24 + -3) = *(byte *)((long)puVar24 + -3) | 0x40;
                *(byte *)((long)puVar24 + 5) = *(byte *)((long)puVar24 + 5) | 0x10;
                uVar10 = uVar10 | uVar18 << 0x1c | 0x2000;
                *(ulong *)(puVar24 + 0x41) =
                     CONCAT44(uVar18 << 0x12,4) | 0x200000000 | *(ulong *)(puVar24 + 0x41);
                *(byte *)(puVar24 + 0x43) = (byte)puVar24[0x43] | 1;
              }
              uVar10 = uVar10 | 0x40000000;
            }
            *puVar24 = uVar10;
          }
          iVar16 = iVar16 + 1;
          puVar23 = puVar24 + 1;
          puVar27 = puVar26 + 1;
        } while (iVar16 != 0x40);
        puVar27 = puVar26 + 0xc1;
        puVar23 = puVar24 + 3;
        bVar29 = uVar15 < 0x3c;
        uVar15 = uVar15 + 4;
      } while (bVar29);
    }
    (t1->mqc).curctx = ppoVar17;
    (t1->mqc).c = uVar13;
    (t1->mqc).a = uVar12;
    (t1->mqc).ct = OVar22;
  }
  else {
    puVar23 = t1->flags + (uVar13 + 3);
    uVar9 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    puVar27 = (uint *)t1->data;
    ppoVar17 = (t1->mqc).curctx;
    uVar12 = (t1->mqc).c;
    uVar15 = (t1->mqc).a;
    OVar22 = (t1->mqc).ct;
    uVar8 = t1->h;
    if ((cblksty & 8U) == 0) {
      local_48 = 0;
      if (3 < uVar8) {
        uVar10 = -uVar9;
        local_48 = 0;
        do {
          if (uVar20 != 0) {
            uVar8 = 0;
            do {
              uVar21 = *puVar23;
              uVar28 = (ulong)uVar21;
              if (uVar28 != 0) {
                if ((uVar21 & 0x1ef) != 0 && (uVar21 & 0x200010) == 0) {
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar28 & 0x1ef];
                  ppoVar17 = (t1->mqc).ctxs + bVar3;
                  poVar6 = (t1->mqc).ctxs[bVar3];
                  uVar18 = poVar6->qeval;
                  uVar19 = uVar15 - uVar18;
                  if (uVar12 >> 0x10 < uVar18) {
                    uVar14 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar19];
                    uVar15 = uVar18;
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar3 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012a411;
                          }
                          uVar12 = uVar12 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar12 = uVar12 + (uint)bVar3 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012a411:
                      uVar15 = uVar15 * 2;
                      uVar12 = uVar12 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar15 < 0x8000);
                    uVar11 = (uint)(uVar14 == 0);
                    if (uVar19 < uVar18) {
                      uVar11 = uVar14;
                    }
                  }
                  else {
                    uVar12 = uVar12 + uVar18 * -0x10000;
                    uVar15 = uVar19;
                    if ((short)uVar19 < 0) {
                      uVar11 = poVar6->mps;
                    }
                    else {
                      uVar14 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar18];
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar3 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar3 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012a494;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012a494:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      uVar11 = (uint)(uVar14 == 0);
                      if (uVar18 <= uVar19) {
                        uVar11 = uVar14;
                      }
                    }
                  }
                  if (uVar11 != 0) {
                    uVar18 = uVar21 >> 0x10 & 0x40 | uVar21 & 0xaa | uVar21 >> 0xe & 0x10 |
                             puVar23[-1] >> 0x13 & 1 | puVar23[1] >> 0x11 & 4;
                    bVar3 = ""[uVar18];
                    ppoVar17 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar18];
                    poVar6 = *ppoVar17;
                    uVar18 = poVar6->qeval;
                    uVar19 = uVar15 - uVar18;
                    if (uVar12 >> 0x10 < uVar18) {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar19];
                      uVar15 = uVar18;
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar4 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012a5ad;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar4 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012a5ad:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar19 < uVar18) {
                        OVar25 = OVar5;
                      }
                    }
                    else {
                      uVar12 = uVar12 + uVar18 * -0x10000;
                      uVar15 = uVar19;
                      if ((short)uVar19 < 0) {
                        OVar25 = poVar6->mps;
                      }
                      else {
                        OVar5 = poVar6->mps;
                        *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar18];
                        do {
                          if (OVar22 == 0) {
                            pOVar7 = (t1->mqc).bp;
                            bVar4 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar7 + 1;
                                uVar12 = uVar12 + (uint)bVar4 * 0x200;
                                OVar22 = 7;
                                goto LAB_0012a627;
                              }
                              uVar12 = uVar12 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x100;
                            }
                            OVar22 = 8;
                          }
LAB_0012a627:
                          uVar15 = uVar15 * 2;
                          uVar12 = uVar12 * 2;
                          OVar22 = OVar22 - 1;
                        } while (uVar15 < 0x8000);
                        OVar25 = (uint)(OVar5 == 0);
                        if (uVar18 <= uVar19) {
                          OVar25 = OVar5;
                        }
                      }
                    }
                    uVar19 = OVar25 ^ bVar3;
                    uVar18 = uVar10;
                    if (OVar25 == bVar3) {
                      uVar18 = uVar9;
                    }
                    *puVar27 = uVar18;
                    *(byte *)(puVar23 + -1) = (byte)puVar23[-1] | 0x20;
                    *(byte *)(puVar23 + 1) = (byte)puVar23[1] | 8;
                    uVar21 = uVar19 << 0x13 | uVar21 | 0x10;
                    uVar28 = (ulong)(t1->w + 2);
                    *(ulong *)(puVar23 + (-1 - uVar28)) =
                         CONCAT44(uVar19 << 0x1f,0x20000) | 0x1000000000000 |
                         *(ulong *)(puVar23 + (-1 - uVar28));
                    pbVar2 = (byte *)((long)puVar23 + uVar28 * -4 + 5);
                    *pbVar2 = *pbVar2 | 0x80;
                  }
                  uVar28 = (ulong)(uVar21 | 0x200000);
                }
                uVar21 = (uint)uVar28;
                if ((uVar28 & 0xf78) != 0 && (uVar28 & 0x1000080) == 0) {
                  uVar19 = (uint)(uVar28 >> 3);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
                  ppoVar17 = (t1->mqc).ctxs + bVar3;
                  poVar6 = (t1->mqc).ctxs[bVar3];
                  uVar18 = poVar6->qeval;
                  uVar14 = uVar15 - uVar18;
                  if (uVar12 >> 0x10 < uVar18) {
                    OVar5 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar14];
                    uVar15 = uVar18;
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar3 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012a792;
                          }
                          uVar12 = uVar12 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar12 = uVar12 + (uint)bVar3 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012a792:
                      uVar15 = uVar15 * 2;
                      uVar12 = uVar12 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar15 < 0x8000);
                    OVar25 = (uint)(OVar5 == 0);
                    if (uVar14 < uVar18) {
                      OVar25 = OVar5;
                    }
                  }
                  else {
                    uVar12 = uVar12 + uVar18 * -0x10000;
                    uVar15 = uVar14;
                    if ((short)uVar14 < 0) {
                      OVar25 = poVar6->mps;
                    }
                    else {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar14 < uVar18];
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar3 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar3 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012a80c;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012a80c:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar18 <= uVar14) {
                        OVar25 = OVar5;
                      }
                    }
                  }
                  if (OVar25 != 0) {
                    uVar18 = (uint)(uVar28 >> 0x13) & 0x40 | uVar19 & 0xaa |
                             (uint)(uVar28 >> 0xf) & 0x10 | puVar23[-1] >> 0x16 & 1 |
                             puVar23[1] >> 0x14 & 4;
                    bVar3 = ""[uVar18];
                    ppoVar17 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar18];
                    poVar6 = *ppoVar17;
                    uVar18 = poVar6->qeval;
                    uVar19 = uVar15 - uVar18;
                    if (uVar12 >> 0x10 < uVar18) {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar19];
                      uVar15 = uVar18;
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar4 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012a91f;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar4 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012a91f:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar19 < uVar18) {
                        OVar25 = OVar5;
                      }
                    }
                    else {
                      uVar12 = uVar12 + uVar18 * -0x10000;
                      uVar15 = uVar19;
                      if ((short)uVar19 < 0) {
                        OVar25 = poVar6->mps;
                      }
                      else {
                        OVar5 = poVar6->mps;
                        *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar18];
                        do {
                          if (OVar22 == 0) {
                            pOVar7 = (t1->mqc).bp;
                            bVar4 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar7 + 1;
                                uVar12 = uVar12 + (uint)bVar4 * 0x200;
                                OVar22 = 7;
                                goto LAB_0012a999;
                              }
                              uVar12 = uVar12 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x100;
                            }
                            OVar22 = 8;
                          }
LAB_0012a999:
                          uVar15 = uVar15 * 2;
                          uVar12 = uVar12 * 2;
                          OVar22 = OVar22 - 1;
                        } while (uVar15 < 0x8000);
                        OVar25 = (uint)(OVar5 == 0);
                        if (uVar18 <= uVar19) {
                          OVar25 = OVar5;
                        }
                      }
                    }
                    uVar18 = uVar10;
                    if (OVar25 == bVar3) {
                      uVar18 = uVar9;
                    }
                    puVar27[uVar20] = uVar18;
                    *(byte *)((long)puVar23 + -3) = *(byte *)((long)puVar23 + -3) | 1;
                    uVar21 = uVar21 | (OVar25 ^ bVar3) << 0x16 | 0x80;
                    *(byte *)(puVar23 + 1) = (byte)puVar23[1] | 0x40;
                  }
                  uVar28 = (ulong)(uVar21 | 0x1000000);
                }
                uVar21 = (uint)uVar28;
                if ((uVar28 & 0x7bc0) != 0 && (uVar28 & 0x8000400) == 0) {
                  uVar19 = (uint)(uVar28 >> 6);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
                  ppoVar17 = (t1->mqc).ctxs + bVar3;
                  poVar6 = (t1->mqc).ctxs[bVar3];
                  uVar18 = poVar6->qeval;
                  uVar14 = uVar15 - uVar18;
                  if (uVar12 >> 0x10 < uVar18) {
                    OVar5 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar14];
                    uVar15 = uVar18;
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar3 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012aac7;
                          }
                          uVar12 = uVar12 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar12 = uVar12 + (uint)bVar3 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012aac7:
                      uVar15 = uVar15 * 2;
                      uVar12 = uVar12 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar15 < 0x8000);
                    OVar25 = (uint)(OVar5 == 0);
                    if (uVar14 < uVar18) {
                      OVar25 = OVar5;
                    }
                  }
                  else {
                    uVar12 = uVar12 + uVar18 * -0x10000;
                    uVar15 = uVar14;
                    if ((short)uVar14 < 0) {
                      OVar25 = poVar6->mps;
                    }
                    else {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar14 < uVar18];
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar3 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar3 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012ab41;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012ab41:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar18 <= uVar14) {
                        OVar25 = OVar5;
                      }
                    }
                  }
                  if (OVar25 != 0) {
                    uVar18 = (uint)(uVar28 >> 0x16) & 0x40 | uVar19 & 0xaa |
                             (uint)(uVar28 >> 0x12) & 0x10 | puVar23[-1] >> 0x19 & 1 |
                             puVar23[1] >> 0x17 & 4;
                    bVar3 = ""[uVar18];
                    ppoVar17 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar18];
                    poVar6 = *ppoVar17;
                    uVar18 = poVar6->qeval;
                    uVar19 = uVar15 - uVar18;
                    if (uVar12 >> 0x10 < uVar18) {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar19];
                      uVar15 = uVar18;
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar4 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012ac54;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar4 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012ac54:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar19 < uVar18) {
                        OVar25 = OVar5;
                      }
                    }
                    else {
                      uVar12 = uVar12 + uVar18 * -0x10000;
                      uVar15 = uVar19;
                      if ((short)uVar19 < 0) {
                        OVar25 = poVar6->mps;
                      }
                      else {
                        OVar5 = poVar6->mps;
                        *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar18];
                        do {
                          if (OVar22 == 0) {
                            pOVar7 = (t1->mqc).bp;
                            bVar4 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar7 + 1;
                                uVar12 = uVar12 + (uint)bVar4 * 0x200;
                                OVar22 = 7;
                                goto LAB_0012acce;
                              }
                              uVar12 = uVar12 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x100;
                            }
                            OVar22 = 8;
                          }
LAB_0012acce:
                          uVar15 = uVar15 * 2;
                          uVar12 = uVar12 * 2;
                          OVar22 = OVar22 - 1;
                        } while (uVar15 < 0x8000);
                        OVar25 = (uint)(OVar5 == 0);
                        if (uVar18 <= uVar19) {
                          OVar25 = OVar5;
                        }
                      }
                    }
                    uVar18 = uVar10;
                    if (OVar25 == bVar3) {
                      uVar18 = uVar9;
                    }
                    puVar27[uVar13 * 2] = uVar18;
                    *(byte *)((long)puVar23 + -3) = *(byte *)((long)puVar23 + -3) | 8;
                    uVar21 = uVar21 | (OVar25 ^ bVar3) << 0x19 | 0x400;
                    *(byte *)((long)puVar23 + 5) = *(byte *)((long)puVar23 + 5) | 2;
                  }
                  uVar28 = (ulong)(uVar21 | 0x8000000);
                }
                uVar21 = (uint)uVar28;
                if ((uVar28 & 0x3de00) != 0 && (uVar28 & 0x40002000) == 0) {
                  uVar19 = (uint)(uVar28 >> 9);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
                  ppoVar17 = (t1->mqc).ctxs + bVar3;
                  poVar6 = (t1->mqc).ctxs[bVar3];
                  uVar18 = poVar6->qeval;
                  uVar14 = uVar15 - uVar18;
                  if (uVar12 >> 0x10 < uVar18) {
                    OVar5 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar14];
                    uVar15 = uVar18;
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar3 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012adfc;
                          }
                          uVar12 = uVar12 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar12 = uVar12 + (uint)bVar3 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012adfc:
                      uVar15 = uVar15 * 2;
                      uVar12 = uVar12 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar15 < 0x8000);
                    OVar25 = (uint)(OVar5 == 0);
                    if (uVar14 < uVar18) {
                      OVar25 = OVar5;
                    }
                  }
                  else {
                    uVar12 = uVar12 + uVar18 * -0x10000;
                    uVar15 = uVar14;
                    if ((short)uVar14 < 0) {
                      OVar25 = poVar6->mps;
                    }
                    else {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar14 < uVar18];
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar3 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar3 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012ae76;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012ae76:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar18 <= uVar14) {
                        OVar25 = OVar5;
                      }
                    }
                  }
                  if (OVar25 != 0) {
                    uVar18 = (uint)(uVar28 >> 0x19) & 0x40 | uVar19 & 0xaa |
                             (uint)(uVar28 >> 0x15) & 0x10 | puVar23[-1] >> 0x1c & 1 |
                             puVar23[1] >> 0x1a & 4;
                    bVar3 = ""[uVar18];
                    ppoVar17 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar18];
                    poVar6 = *ppoVar17;
                    uVar18 = poVar6->qeval;
                    uVar19 = uVar15 - uVar18;
                    if (uVar12 >> 0x10 < uVar18) {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar19];
                      uVar15 = uVar18;
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar4 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012af89;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar4 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012af89:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar19 < uVar18) {
                        OVar25 = OVar5;
                      }
                    }
                    else {
                      uVar12 = uVar12 + uVar18 * -0x10000;
                      uVar15 = uVar19;
                      if ((short)uVar19 < 0) {
                        OVar25 = poVar6->mps;
                      }
                      else {
                        OVar5 = poVar6->mps;
                        *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar18];
                        do {
                          if (OVar22 == 0) {
                            pOVar7 = (t1->mqc).bp;
                            bVar4 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar7 + 1;
                                uVar12 = uVar12 + (uint)bVar4 * 0x200;
                                OVar22 = 7;
                                goto LAB_0012b003;
                              }
                              uVar12 = uVar12 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x100;
                            }
                            OVar22 = 8;
                          }
LAB_0012b003:
                          uVar15 = uVar15 * 2;
                          uVar12 = uVar12 * 2;
                          OVar22 = OVar22 - 1;
                        } while (uVar15 < 0x8000);
                        OVar25 = (uint)(OVar5 == 0);
                        if (uVar18 <= uVar19) {
                          OVar25 = OVar5;
                        }
                      }
                    }
                    uVar19 = OVar25 ^ bVar3;
                    uVar18 = uVar10;
                    if (OVar25 == bVar3) {
                      uVar18 = uVar9;
                    }
                    puVar27[uVar13 * 3] = uVar18;
                    *(byte *)((long)puVar23 + -3) = *(byte *)((long)puVar23 + -3) | 0x40;
                    uVar21 = uVar21 | uVar19 << 0x1c | 0x2000;
                    *(byte *)((long)puVar23 + 5) = *(byte *)((long)puVar23 + 5) | 0x10;
                    uVar28 = (ulong)(t1->w + 2);
                    *(ulong *)(puVar23 + (uVar28 - 1)) =
                         CONCAT44(uVar19 << 0x12,4) | 0x200000000 |
                         *(ulong *)(puVar23 + (uVar28 - 1));
                    *(byte *)(puVar23 + uVar28 + 1) = (byte)puVar23[uVar28 + 1] | 1;
                  }
                  uVar21 = uVar21 | 0x40000000;
                }
                *puVar23 = uVar21;
              }
              uVar8 = uVar8 + 1;
              puVar27 = puVar27 + 1;
              puVar23 = puVar23 + 1;
            } while (uVar8 != uVar13);
            uVar8 = t1->h;
          }
          local_48 = local_48 + 4;
          puVar27 = puVar27 + uVar13 * 3;
          puVar23 = puVar23 + 2;
        } while (local_48 < (uVar8 & 0xfffffffc));
      }
      (t1->mqc).curctx = ppoVar17;
      (t1->mqc).c = uVar12;
      (t1->mqc).a = uVar15;
      (t1->mqc).ct = OVar22;
      if ((uVar20 != 0) && (local_48 < uVar8)) {
        uVar12 = 0;
        do {
          bVar29 = uVar8 != local_48;
          uVar8 = local_48;
          if (bVar29) {
            uVar20 = 0;
            uVar28 = 0;
            do {
              opj_t1_dec_sigpass_step_mqc
                        (t1,puVar23,(OPJ_INT32 *)(puVar27 + uVar20),uVar9,(OPJ_UINT32)uVar28,
                         t1->w + 2,0);
              uVar28 = uVar28 + 1;
              uVar8 = t1->h;
              uVar20 = (ulong)((int)uVar20 + uVar13);
            } while (uVar28 < uVar8 - local_48);
          }
          uVar12 = uVar12 + 1;
          puVar27 = puVar27 + 1;
          puVar23 = puVar23 + 1;
        } while (uVar12 != uVar13);
      }
    }
    else {
      local_48 = 0;
      if (3 < uVar8) {
        uVar10 = -uVar9;
        local_48 = 0;
        do {
          if (uVar20 != 0) {
            uVar8 = 0;
            do {
              uVar21 = *puVar23;
              uVar28 = (ulong)uVar21;
              if (uVar28 != 0) {
                if ((uVar21 & 0x1ef) != 0 && (uVar21 & 0x200010) == 0) {
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar28 & 0x1ef];
                  ppoVar17 = (t1->mqc).ctxs + bVar3;
                  poVar6 = (t1->mqc).ctxs[bVar3];
                  uVar18 = poVar6->qeval;
                  uVar19 = uVar15 - uVar18;
                  if (uVar12 >> 0x10 < uVar18) {
                    uVar14 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar19];
                    uVar15 = uVar18;
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar3 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012b2b2;
                          }
                          uVar12 = uVar12 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar12 = uVar12 + (uint)bVar3 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012b2b2:
                      uVar15 = uVar15 * 2;
                      uVar12 = uVar12 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar15 < 0x8000);
                    uVar11 = (uint)(uVar14 == 0);
                    if (uVar19 < uVar18) {
                      uVar11 = uVar14;
                    }
                  }
                  else {
                    uVar12 = uVar12 + uVar18 * -0x10000;
                    uVar15 = uVar19;
                    if ((short)uVar19 < 0) {
                      uVar11 = poVar6->mps;
                    }
                    else {
                      uVar14 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar18];
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar3 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar3 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012b335;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012b335:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      uVar11 = (uint)(uVar14 == 0);
                      if (uVar18 <= uVar19) {
                        uVar11 = uVar14;
                      }
                    }
                  }
                  if (uVar11 != 0) {
                    uVar18 = uVar21 >> 0x10 & 0x40 | uVar21 & 0xaa | uVar21 >> 0xe & 0x10 |
                             puVar23[-1] >> 0x13 & 1 | puVar23[1] >> 0x11 & 4;
                    bVar3 = ""[uVar18];
                    ppoVar17 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar18];
                    poVar6 = *ppoVar17;
                    uVar18 = poVar6->qeval;
                    uVar19 = uVar15 - uVar18;
                    if (uVar12 >> 0x10 < uVar18) {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar19];
                      uVar15 = uVar18;
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar4 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012b44b;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar4 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012b44b:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar19 < uVar18) {
                        OVar25 = OVar5;
                      }
                    }
                    else {
                      uVar12 = uVar12 + uVar18 * -0x10000;
                      uVar15 = uVar19;
                      if ((short)uVar19 < 0) {
                        OVar25 = poVar6->mps;
                      }
                      else {
                        OVar5 = poVar6->mps;
                        *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar18];
                        do {
                          if (OVar22 == 0) {
                            pOVar7 = (t1->mqc).bp;
                            bVar4 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar7 + 1;
                                uVar12 = uVar12 + (uint)bVar4 * 0x200;
                                OVar22 = 7;
                                goto LAB_0012b4c5;
                              }
                              uVar12 = uVar12 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x100;
                            }
                            OVar22 = 8;
                          }
LAB_0012b4c5:
                          uVar15 = uVar15 * 2;
                          uVar12 = uVar12 * 2;
                          OVar22 = OVar22 - 1;
                        } while (uVar15 < 0x8000);
                        OVar25 = (uint)(OVar5 == 0);
                        if (uVar18 <= uVar19) {
                          OVar25 = OVar5;
                        }
                      }
                    }
                    uVar18 = uVar10;
                    if (OVar25 == bVar3) {
                      uVar18 = uVar9;
                    }
                    *puVar27 = uVar18;
                    *(byte *)(puVar23 + -1) = (byte)puVar23[-1] | 0x20;
                    uVar21 = (OVar25 ^ bVar3) << 0x13 | uVar21 | 0x10;
                    *(byte *)(puVar23 + 1) = (byte)puVar23[1] | 8;
                  }
                  uVar28 = (ulong)(uVar21 | 0x200000);
                }
                uVar21 = (uint)uVar28;
                if ((uVar28 & 0xf78) != 0 && (uVar28 & 0x1000080) == 0) {
                  uVar19 = (uint)(uVar28 >> 3);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
                  ppoVar17 = (t1->mqc).ctxs + bVar3;
                  poVar6 = (t1->mqc).ctxs[bVar3];
                  uVar18 = poVar6->qeval;
                  uVar14 = uVar15 - uVar18;
                  if (uVar12 >> 0x10 < uVar18) {
                    OVar5 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar14];
                    uVar15 = uVar18;
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar3 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012b5ec;
                          }
                          uVar12 = uVar12 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar12 = uVar12 + (uint)bVar3 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012b5ec:
                      uVar15 = uVar15 * 2;
                      uVar12 = uVar12 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar15 < 0x8000);
                    OVar25 = (uint)(OVar5 == 0);
                    if (uVar14 < uVar18) {
                      OVar25 = OVar5;
                    }
                  }
                  else {
                    uVar12 = uVar12 + uVar18 * -0x10000;
                    uVar15 = uVar14;
                    if ((short)uVar14 < 0) {
                      OVar25 = poVar6->mps;
                    }
                    else {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar14 < uVar18];
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar3 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar3 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012b666;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012b666:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar18 <= uVar14) {
                        OVar25 = OVar5;
                      }
                    }
                  }
                  if (OVar25 != 0) {
                    uVar18 = (uint)(uVar28 >> 0x13) & 0x40 | uVar19 & 0xaa |
                             (uint)(uVar28 >> 0xf) & 0x10 | puVar23[-1] >> 0x16 & 1 |
                             puVar23[1] >> 0x14 & 4;
                    bVar3 = ""[uVar18];
                    ppoVar17 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar18];
                    poVar6 = *ppoVar17;
                    uVar18 = poVar6->qeval;
                    uVar19 = uVar15 - uVar18;
                    if (uVar12 >> 0x10 < uVar18) {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar19];
                      uVar15 = uVar18;
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar4 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012b779;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar4 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012b779:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar19 < uVar18) {
                        OVar25 = OVar5;
                      }
                    }
                    else {
                      uVar12 = uVar12 + uVar18 * -0x10000;
                      uVar15 = uVar19;
                      if ((short)uVar19 < 0) {
                        OVar25 = poVar6->mps;
                      }
                      else {
                        OVar5 = poVar6->mps;
                        *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar18];
                        do {
                          if (OVar22 == 0) {
                            pOVar7 = (t1->mqc).bp;
                            bVar4 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar7 + 1;
                                uVar12 = uVar12 + (uint)bVar4 * 0x200;
                                OVar22 = 7;
                                goto LAB_0012b7f3;
                              }
                              uVar12 = uVar12 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x100;
                            }
                            OVar22 = 8;
                          }
LAB_0012b7f3:
                          uVar15 = uVar15 * 2;
                          uVar12 = uVar12 * 2;
                          OVar22 = OVar22 - 1;
                        } while (uVar15 < 0x8000);
                        OVar25 = (uint)(OVar5 == 0);
                        if (uVar18 <= uVar19) {
                          OVar25 = OVar5;
                        }
                      }
                    }
                    uVar18 = uVar10;
                    if (OVar25 == bVar3) {
                      uVar18 = uVar9;
                    }
                    puVar27[uVar20] = uVar18;
                    *(byte *)((long)puVar23 + -3) = *(byte *)((long)puVar23 + -3) | 1;
                    uVar21 = uVar21 | (OVar25 ^ bVar3) << 0x16 | 0x80;
                    *(byte *)(puVar23 + 1) = (byte)puVar23[1] | 0x40;
                  }
                  uVar28 = (ulong)(uVar21 | 0x1000000);
                }
                uVar21 = (uint)uVar28;
                if ((uVar28 & 0x7bc0) != 0 && (uVar28 & 0x8000400) == 0) {
                  uVar19 = (uint)(uVar28 >> 6);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
                  ppoVar17 = (t1->mqc).ctxs + bVar3;
                  poVar6 = (t1->mqc).ctxs[bVar3];
                  uVar18 = poVar6->qeval;
                  uVar14 = uVar15 - uVar18;
                  if (uVar12 >> 0x10 < uVar18) {
                    OVar5 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar14];
                    uVar15 = uVar18;
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar3 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012b921;
                          }
                          uVar12 = uVar12 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar12 = uVar12 + (uint)bVar3 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012b921:
                      uVar15 = uVar15 * 2;
                      uVar12 = uVar12 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar15 < 0x8000);
                    OVar25 = (uint)(OVar5 == 0);
                    if (uVar14 < uVar18) {
                      OVar25 = OVar5;
                    }
                  }
                  else {
                    uVar12 = uVar12 + uVar18 * -0x10000;
                    uVar15 = uVar14;
                    if ((short)uVar14 < 0) {
                      OVar25 = poVar6->mps;
                    }
                    else {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar14 < uVar18];
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar3 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar3 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012b99b;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012b99b:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar18 <= uVar14) {
                        OVar25 = OVar5;
                      }
                    }
                  }
                  if (OVar25 != 0) {
                    uVar18 = (uint)(uVar28 >> 0x16) & 0x40 | uVar19 & 0xaa |
                             (uint)(uVar28 >> 0x12) & 0x10 | puVar23[-1] >> 0x19 & 1 |
                             puVar23[1] >> 0x17 & 4;
                    bVar3 = ""[uVar18];
                    ppoVar17 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar18];
                    poVar6 = *ppoVar17;
                    uVar18 = poVar6->qeval;
                    uVar19 = uVar15 - uVar18;
                    if (uVar12 >> 0x10 < uVar18) {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar19];
                      uVar15 = uVar18;
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar4 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012baae;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar4 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012baae:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar19 < uVar18) {
                        OVar25 = OVar5;
                      }
                    }
                    else {
                      uVar12 = uVar12 + uVar18 * -0x10000;
                      uVar15 = uVar19;
                      if ((short)uVar19 < 0) {
                        OVar25 = poVar6->mps;
                      }
                      else {
                        OVar5 = poVar6->mps;
                        *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar18];
                        do {
                          if (OVar22 == 0) {
                            pOVar7 = (t1->mqc).bp;
                            bVar4 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar7 + 1;
                                uVar12 = uVar12 + (uint)bVar4 * 0x200;
                                OVar22 = 7;
                                goto LAB_0012bb28;
                              }
                              uVar12 = uVar12 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x100;
                            }
                            OVar22 = 8;
                          }
LAB_0012bb28:
                          uVar15 = uVar15 * 2;
                          uVar12 = uVar12 * 2;
                          OVar22 = OVar22 - 1;
                        } while (uVar15 < 0x8000);
                        OVar25 = (uint)(OVar5 == 0);
                        if (uVar18 <= uVar19) {
                          OVar25 = OVar5;
                        }
                      }
                    }
                    uVar18 = uVar10;
                    if (OVar25 == bVar3) {
                      uVar18 = uVar9;
                    }
                    puVar27[uVar13 * 2] = uVar18;
                    *(byte *)((long)puVar23 + -3) = *(byte *)((long)puVar23 + -3) | 8;
                    uVar21 = uVar21 | (OVar25 ^ bVar3) << 0x19 | 0x400;
                    *(byte *)((long)puVar23 + 5) = *(byte *)((long)puVar23 + 5) | 2;
                  }
                  uVar28 = (ulong)(uVar21 | 0x8000000);
                }
                uVar21 = (uint)uVar28;
                if ((uVar28 & 0x3de00) != 0 && (uVar28 & 0x40002000) == 0) {
                  uVar19 = (uint)(uVar28 >> 9);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar19 & 0x1ef];
                  ppoVar17 = (t1->mqc).ctxs + bVar3;
                  poVar6 = (t1->mqc).ctxs[bVar3];
                  uVar18 = poVar6->qeval;
                  uVar14 = uVar15 - uVar18;
                  if (uVar12 >> 0x10 < uVar18) {
                    OVar5 = poVar6->mps;
                    *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar14];
                    uVar15 = uVar18;
                    do {
                      if (OVar22 == 0) {
                        pOVar7 = (t1->mqc).bp;
                        bVar3 = pOVar7[1];
                        if (*pOVar7 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x200;
                            OVar22 = 7;
                            goto LAB_0012bc56;
                          }
                          uVar12 = uVar12 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar7 + 1;
                          uVar12 = uVar12 + (uint)bVar3 * 0x100;
                        }
                        OVar22 = 8;
                      }
LAB_0012bc56:
                      uVar15 = uVar15 * 2;
                      uVar12 = uVar12 * 2;
                      OVar22 = OVar22 - 1;
                    } while (uVar15 < 0x8000);
                    OVar25 = (uint)(OVar5 == 0);
                    if (uVar14 < uVar18) {
                      OVar25 = OVar5;
                    }
                  }
                  else {
                    uVar12 = uVar12 + uVar18 * -0x10000;
                    uVar15 = uVar14;
                    if ((short)uVar14 < 0) {
                      OVar25 = poVar6->mps;
                    }
                    else {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar14 < uVar18];
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar3 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar3 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012bcd0;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar3 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012bcd0:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar18 <= uVar14) {
                        OVar25 = OVar5;
                      }
                    }
                  }
                  if (OVar25 != 0) {
                    uVar18 = (uint)(uVar28 >> 0x19) & 0x40 | uVar19 & 0xaa |
                             (uint)(uVar28 >> 0x15) & 0x10 | puVar23[-1] >> 0x1c & 1 |
                             puVar23[1] >> 0x1a & 4;
                    bVar3 = ""[uVar18];
                    ppoVar17 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar18];
                    poVar6 = *ppoVar17;
                    uVar18 = poVar6->qeval;
                    uVar19 = uVar15 - uVar18;
                    if (uVar12 >> 0x10 < uVar18) {
                      OVar5 = poVar6->mps;
                      *ppoVar17 = (&poVar6->nmps)[uVar18 <= uVar19];
                      uVar15 = uVar18;
                      do {
                        if (OVar22 == 0) {
                          pOVar7 = (t1->mqc).bp;
                          bVar4 = pOVar7[1];
                          if (*pOVar7 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x200;
                              OVar22 = 7;
                              goto LAB_0012bde3;
                            }
                            uVar12 = uVar12 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar7 + 1;
                            uVar12 = uVar12 + (uint)bVar4 * 0x100;
                          }
                          OVar22 = 8;
                        }
LAB_0012bde3:
                        uVar15 = uVar15 * 2;
                        uVar12 = uVar12 * 2;
                        OVar22 = OVar22 - 1;
                      } while (uVar15 < 0x8000);
                      OVar25 = (uint)(OVar5 == 0);
                      if (uVar19 < uVar18) {
                        OVar25 = OVar5;
                      }
                    }
                    else {
                      uVar12 = uVar12 + uVar18 * -0x10000;
                      uVar15 = uVar19;
                      if ((short)uVar19 < 0) {
                        OVar25 = poVar6->mps;
                      }
                      else {
                        OVar5 = poVar6->mps;
                        *ppoVar17 = (&poVar6->nmps)[uVar19 < uVar18];
                        do {
                          if (OVar22 == 0) {
                            pOVar7 = (t1->mqc).bp;
                            bVar4 = pOVar7[1];
                            if (*pOVar7 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar7 + 1;
                                uVar12 = uVar12 + (uint)bVar4 * 0x200;
                                OVar22 = 7;
                                goto LAB_0012be5d;
                              }
                              uVar12 = uVar12 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar7 + 1;
                              uVar12 = uVar12 + (uint)bVar4 * 0x100;
                            }
                            OVar22 = 8;
                          }
LAB_0012be5d:
                          uVar15 = uVar15 * 2;
                          uVar12 = uVar12 * 2;
                          OVar22 = OVar22 - 1;
                        } while (uVar15 < 0x8000);
                        OVar25 = (uint)(OVar5 == 0);
                        if (uVar18 <= uVar19) {
                          OVar25 = OVar5;
                        }
                      }
                    }
                    uVar19 = OVar25 ^ bVar3;
                    uVar18 = uVar10;
                    if (OVar25 == bVar3) {
                      uVar18 = uVar9;
                    }
                    puVar27[uVar13 * 3] = uVar18;
                    *(byte *)((long)puVar23 + -3) = *(byte *)((long)puVar23 + -3) | 0x40;
                    uVar21 = uVar21 | uVar19 << 0x1c | 0x2000;
                    *(byte *)((long)puVar23 + 5) = *(byte *)((long)puVar23 + 5) | 0x10;
                    uVar28 = (ulong)(t1->w + 2);
                    *(ulong *)(puVar23 + (uVar28 - 1)) =
                         CONCAT44(uVar19 << 0x12,4) | 0x200000000 |
                         *(ulong *)(puVar23 + (uVar28 - 1));
                    *(byte *)(puVar23 + uVar28 + 1) = (byte)puVar23[uVar28 + 1] | 1;
                  }
                  uVar21 = uVar21 | 0x40000000;
                }
                *puVar23 = uVar21;
              }
              uVar8 = uVar8 + 1;
              puVar27 = puVar27 + 1;
              puVar23 = puVar23 + 1;
            } while (uVar8 != uVar13);
            uVar8 = t1->h;
          }
          local_48 = local_48 + 4;
          puVar27 = puVar27 + uVar13 * 3;
          puVar23 = puVar23 + 2;
        } while (local_48 < (uVar8 & 0xfffffffc));
      }
      (t1->mqc).curctx = ppoVar17;
      (t1->mqc).c = uVar12;
      (t1->mqc).a = uVar15;
      (t1->mqc).ct = OVar22;
      if ((uVar20 != 0) && (local_48 < uVar8)) {
        uVar12 = 0;
        do {
          bVar29 = uVar8 != local_48;
          uVar8 = local_48;
          if (bVar29) {
            uVar20 = 0;
            uVar28 = 0;
            do {
              opj_t1_dec_sigpass_step_mqc
                        (t1,puVar23,(OPJ_INT32 *)(puVar27 + uVar20),uVar9,(OPJ_UINT32)uVar28,
                         t1->w + 2,1);
              uVar28 = uVar28 + 1;
              uVar8 = t1->h;
              uVar20 = (ulong)((int)uVar20 + uVar13);
            } while (uVar28 < uVar8 - local_48);
          }
          uVar12 = uVar12 + 1;
          puVar27 = puVar27 + 1;
          puVar23 = puVar23 + 1;
        } while (uVar12 != uVar13);
      }
    }
  }
  return;
}

Assistant:

static void opj_t1_dec_sigpass_mqc(
    opj_t1_t *t1,
    OPJ_INT32 bpno,
    OPJ_INT32 cblksty)
{
    if (t1->w == 64 && t1->h == 64) {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_sigpass_mqc_64x64_vsc(t1, bpno);
        } else {
            opj_t1_dec_sigpass_mqc_64x64_novsc(t1, bpno);
        }
    } else {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_sigpass_mqc_generic_vsc(t1, bpno);
        } else {
            opj_t1_dec_sigpass_mqc_generic_novsc(t1, bpno);
        }
    }
}